

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void s_split(string *s,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *tokens,char delim)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  size_t local_68;
  size_t pos;
  size_t local_50;
  size_t lastPos;
  anon_class_40_2_b75c6d7b string_find_first_not;
  char delim_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  string *s_local;
  
  string_find_first_not._39_1_ = delim;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(tokens);
  std::__cxx11::string::string((string *)&lastPos,(string *)s);
  string_find_first_not.s.field_2._M_local_buf[8] = string_find_first_not._39_1_;
  local_50 = s_split::anon_class_40_2_b75c6d7b::operator()((anon_class_40_2_b75c6d7b *)&lastPos,0);
  local_68 = std::__cxx11::string::find
                       ((char)s,(ulong)(uint)(int)(char)string_find_first_not._39_1_);
  while (local_50 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)tokens,&local_88
              );
    std::__cxx11::string::~string((string *)&local_88);
    local_50 = s_split::anon_class_40_2_b75c6d7b::operator()
                         ((anon_class_40_2_b75c6d7b *)&lastPos,local_68);
    local_68 = std::__cxx11::string::find
                         ((char)s,(ulong)(uint)(int)(char)string_find_first_not._39_1_);
  }
  s_split(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,char)
  ::$_0::~__0((__0 *)&lastPos);
  return;
}

Assistant:

void s_split(const string &s, vector<string> &tokens, char delim = ' ')
{
    tokens.clear();
    auto string_find_first_not = [s, delim](size_t pos = 0) -> size_t {
        for (size_t i = pos; i < s.size(); i++) {
            if (s[i] != delim)
                return i;
        }
        return string::npos;
    };
    size_t lastPos = string_find_first_not(0);
    size_t pos = s.find(delim, lastPos);
    while (lastPos != string::npos) {
        tokens.emplace_back(s.substr(lastPos, pos - lastPos));
        lastPos = string_find_first_not(pos);
        pos = s.find(delim, lastPos);
    }
}